

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void SetupServerArgs(ArgsManager *argsman)

{
  string *args;
  char **ppcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ChainType chain;
  OptionsCategory *pOVar3;
  string *psVar4;
  long lVar5;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  undefined6 in_stack_fffffffffffffdc0;
  OptionsCategory local_238;
  allocator_type local_232;
  allocator<char> local_231;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hidden_args;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> regtestChainParams;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> signetChainParams;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> testnet4ChainParams;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> testnetChainParams;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> defaultChainParams;
  unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_> regtestBaseParams;
  unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_> signetBaseParams;
  unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_> testnet4BaseParams;
  unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_> testnetBaseParams;
  unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_> defaultBaseParams;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48;
  undefined8 local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  SetupHelpOptions(argsman);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-help-debug",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Print help message with debugging options and exit",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  init::AddLoggingArgs(argsman);
  CreateBaseChainParams((ChainType)&defaultBaseParams);
  CreateBaseChainParams((ChainType)&testnetBaseParams);
  CreateBaseChainParams((ChainType)&testnet4BaseParams);
  CreateBaseChainParams((ChainType)&signetBaseParams);
  CreateBaseChainParams((ChainType)&regtestBaseParams);
  chain = (ChainType)argsman;
  CreateChainParams((ArgsManager *)&defaultChainParams,chain);
  CreateChainParams((ArgsManager *)&testnetChainParams,chain);
  CreateChainParams((ArgsManager *)&testnet4ChainParams,chain);
  CreateChainParams((ArgsManager *)&signetChainParams,chain);
  CreateChainParams((ArgsManager *)&regtestChainParams,chain);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-dbcrashratio",(allocator<char> *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"-forcecompactdb",(allocator<char> *)&local_168);
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"-choosedatadir",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e8,"-lang=<lang>",(allocator<char> *)&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"-min",(allocator<char> *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"-resetguisettings",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"-splash",(allocator<char> *)&stack0xfffffffffffffdc6);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"-uiplatform",&local_231);
  __l._M_len = 8;
  __l._M_array = &local_148;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&hidden_args,__l,&local_232);
  lVar5 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_148._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-version",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Print version and exit",(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p = local_168._M_dataplus._M_p & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-alertnotify=<cmd>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Execute command when an alert is raised (%s in cmd is replaced by message)",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p = local_168._M_dataplus._M_p & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-assumevalid=<hex>",(allocator<char> *)&stack0xfffffffffffffdc6);
  base_blob<256u>::GetHex_abi_cxx11_
            (&local_168,
             (base_blob<256u> *)
             ((long)defaultChainParams._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x130));
  base_blob<256u>::GetHex_abi_cxx11_
            (&local_188,
             (base_blob<256u> *)
             ((long)testnetChainParams._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x130));
  base_blob<256u>::GetHex_abi_cxx11_
            (&local_1a8,
             (base_blob<256u> *)
             ((long)testnet4ChainParams._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x130));
  base_blob<256u>::GetHex_abi_cxx11_
            (&local_1c8,
             (base_blob<256u> *)
             ((long)signetChainParams._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x130));
  pbVar2 = &local_1c8;
  tinyformat::
  format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_48,
             (tinyformat *)
             "If this block is in the chain assume that it and its ancestors are valid and potentially skip their script verification (0 to verify all, default: %s, testnet3: %s, testnet4: %s, signet: %s)"
             ,(char *)&local_168,&local_188,&local_1a8,pbVar2,in_stack_fffffffffffffdb8);
  local_238 = OPTIONS;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,&local_238);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-blocksdir=<dir>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Specify directory to hold blocks subdirectory for *.dat files (default: <datadir>)",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p = local_168._M_dataplus._M_p & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-blocksxor",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Whether an XOR-key applies to blocksdir *.dat files. The created XOR-key will be zeros for an existing blocksdir or when `-blocksxor=0` is set, and random for a freshly initialized blocksdir. (default: %u)"
             ,(bool *)&kernel::DEFAULT_XOR_BLOCKSDIR);
  local_168._M_dataplus._M_p = local_168._M_dataplus._M_p & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-fastprune",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Use smaller block files and lower minimum prune height for testing purposes",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-blocknotify=<cmd>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Execute command when the best block changes (%s in cmd is replaced by block hash)",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-blockreconstructionextratxn=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int>
            (&local_48,
             "Extra transactions to keep in memory for compact block reconstructions (default: %u)",
             &DEFAULT_BLOCK_RECONSTRUCTION_EXTRA_TXN);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-blocksonly",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Whether to reject transactions from network peers. Disables automatic broadcast and rebroadcast of transactions, unless the source peer has the \'forcerelay\' permission. RPC transactions are not affected. (default: %u)"
             ,(bool *)&DEFAULT_BLOCKSONLY);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-coinstatsindex",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Maintain coinstats index used by the gettxoutsetinfo RPC (default: %u)",
             (bool *)&DEFAULT_COINSTATSINDEX);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ppcVar1 = (char **)&DAT_00000001;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-conf=<file>",(allocator<char> *)&local_188);
  tinyformat::format<char_const*>
            (&local_48,
             (tinyformat *)
             "Specify path to read-only configuration file. Relative paths will be prefixed by datadir location (only useable from command line, not configuration file) (default: %s)"
             ,(char *)&BITCOIN_CONF_FILENAME,ppcVar1);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-datadir=<dir>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Specify data directory",(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-dbbatchsize",(allocator<char> *)&local_188);
  tinyformat::format<long>
            (&local_48,"Maximum database write batch size in bytes (default: %u)",
             &nDefaultDbBatchSize);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-dbcache=<n>",(allocator<char> *)&local_188);
  tinyformat::format<long,long,long>
            (&local_48,
             (tinyformat *)
             "Maximum database cache size <n> MiB (%d to %d, default: %d). In addition, unused mempool memory is shared for this cache (see -maxmempool)."
             ,(char *)&nMinDbCache,&nMaxDbCache,&nDefaultDbCache,(long *)pbVar2);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-includeconf=<file>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Specify additional configuration file, relative to the -datadir path (only useable from configuration file, not command line)"
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ppcVar1 = (char **)&DAT_00000001;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-allowignoredconf",(allocator<char> *)&local_188);
  tinyformat::format<char_const*>
            (&local_48,
             (tinyformat *)
             "For backwards compatibility, treat an unused %s file in the datadir as a warning, not an error."
             ,(char *)&BITCOIN_CONF_FILENAME,ppcVar1);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-loadblock=<file>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Imports blocks from external file on startup",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-maxmempool=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int>
            (&local_48,"Keep the transaction memory pool below <n> megabytes (default: %u)",
             &DEFAULT_MAX_MEMPOOL_SIZE_MB);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-maxorphantx=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int>
            (&local_48,"Keep at most <n> unconnectable transactions in memory (default: %u)",
             &DEFAULT_MAX_ORPHAN_TRANSACTIONS);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-mempoolexpiry=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int>
            (&local_48,"Do not keep transactions in the mempool longer than <n> hours (default: %u)"
             ,&DEFAULT_MEMPOOL_EXPIRY_HOURS);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-minimumchainwork=<hex>",
             (allocator<char> *)&stack0xfffffffffffffdc6);
  base_blob<256u>::GetHex_abi_cxx11_
            (&local_168,
             (base_blob<256u> *)
             ((long)defaultChainParams._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x110));
  base_blob<256u>::GetHex_abi_cxx11_
            (&local_188,
             (base_blob<256u> *)
             ((long)testnetChainParams._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x110));
  base_blob<256u>::GetHex_abi_cxx11_
            (&local_1a8,
             (base_blob<256u> *)
             ((long)testnet4ChainParams._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x110));
  base_blob<256u>::GetHex_abi_cxx11_
            (&local_1c8,
             (base_blob<256u> *)
             ((long)signetChainParams._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x110));
  tinyformat::
  format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_48,
             (tinyformat *)
             "Minimum work assumed to exist on a valid chain in hex (default: %s, testnet3: %s, testnet4: %s, signet: %s)"
             ,(char *)&local_168,&local_188,&local_1a8,&local_1c8,in_stack_fffffffffffffdb8);
  pOVar3 = &local_238;
  local_238 = OPTIONS;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,pOVar3);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-par=<n>",(allocator<char> *)&local_188);
  tinyformat::format<int,int>
            (&local_48,
             (tinyformat *)
             "Set the number of script verification threads (0 = auto, up to %d, <0 = leave that many cores free, default: %d)"
             ,(char *)&MAX_SCRIPTCHECK_THREADS,&DEFAULT_SCRIPTCHECK_THREADS,(int *)pOVar3);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-persistmempool",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Whether to save the mempool on shutdown and load on restart (default: %u)",
             (bool *)&node::DEFAULT_PERSIST_MEMPOOL);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-persistmempoolv1",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Whether a mempool.dat file created by -persistmempool or the savemempool RPC will be written in the legacy format (version 1) or the current format (version 2). This temporary option will be removed in the future. (default: %u)"
             ,(bool *)&DEFAULT_PERSIST_V1_DAT);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ppcVar1 = (char **)&DAT_00000001;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-pid=<file>",(allocator<char> *)&local_188);
  tinyformat::format<char_const*>
            (&local_48,
             (tinyformat *)
             "Specify pid file. Relative paths will be prefixed by a net-specific datadir location. (default: %s)"
             ,(char *)&BITCOIN_PID_FILENAME,ppcVar1);
  local_168._M_dataplus._M_p = (pointer)((ulong)local_168._M_dataplus._M_p._4_4_ << 0x20);
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-prune=<n>",(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p = (pointer)0x226;
  tinyformat::format<unsigned_long>
            (&local_48,
             "Reduce storage requirements by enabling pruning (deleting) of old blocks. This allows the pruneblockchain RPC to be called to delete specific blocks and enables automatic pruning of old blocks if a target size in MiB is provided. This mode is incompatible with -txindex. Warning: Reverting this setting requires re-downloading the entire blockchain. (default: 0 = disable pruning blocks, 1 = allow manual pruning via RPC, >=%u = automatically prune block files to stay under the specified target size in MiB)"
             ,(unsigned_long *)&local_168);
  local_188._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_188);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-reindex",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "If enabled, wipe chain state and block index, and rebuild them from blk*.dat files on disk. Also wipe and rebuild other optional indexes that are active. If an assumeutxo snapshot was loaded, its chainstate will be wiped as well. The snapshot can then be reloaded via RPC."
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p = local_168._M_dataplus._M_p & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-reindex-chainstate",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "If enabled, wipe chain state, and rebuild it from blk*.dat files on disk. If an assumeutxo snapshot was loaded, its chainstate will be wiped as well. The snapshot can then be reloaded via RPC."
             ,(allocator<char> *)&local_1a8);
  psVar4 = &local_168;
  local_168._M_dataplus._M_p = local_168._M_dataplus._M_p & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-settings=<file>",(allocator<char> *)&local_188);
  tinyformat::format<char_const*,char_const*>
            (&local_48,
             (tinyformat *)
             "Specify path to dynamic settings data file. Can be disabled with -nosettings. File is written at runtime and not meant to be edited by users (use %s instead for custom settings). Relative paths will be prefixed by datadir location. (default: %s)"
             ,(char *)&BITCOIN_CONF_FILENAME,&BITCOIN_SETTINGS_FILENAME,(char **)psVar4);
  local_168._M_dataplus._M_p = local_168._M_dataplus._M_p & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-startupnotify=<cmd>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Execute command on startup.",(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p = local_168._M_dataplus._M_p & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-shutdownnotify=<cmd>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Execute command immediately before beginning shutdown. The need for shutdown may be urgent, so be careful not to delay it long (if the command doesn\'t require interaction with the server, consider having it fork into the background)."
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p = local_168._M_dataplus._M_p & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-txindex",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Maintain a full transaction index, used by the getrawtransaction rpc call (default: %u)"
             ,(bool *)&DEFAULT_TXINDEX);
  psVar4 = &local_168;
  local_168._M_dataplus._M_p = local_168._M_dataplus._M_p & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-blockfilterindex=<type>",(allocator<char> *)&local_1a8);
  args = ListBlockFilterTypes_abi_cxx11_();
  tinyformat::format<char_const*,std::__cxx11::string>
            (&local_168,
             (tinyformat *)
             "Maintain an index of compact filters by block (default: %s, values: %s).",
             (char *)&DEFAULT_BLOCKFILTERINDEX,(char **)args,psVar4);
  std::operator+(&local_48,&local_168,
                 " If <type> is not supplied or if <type> = 1, indexes for all known types are enabled."
                );
  local_188._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_188);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-addnode=<ip>",(allocator<char> *)&local_188);
  tinyformat::format<int>
            (&local_48,
             "Add a node to connect to and attempt to keep the connection open (see the addnode RPC help for more info). This option can be specified multiple times to add multiple nodes; connections are limited to %u at a time and are counted separately from the -maxconnections limit."
             ,&MAX_ADDNODE_CONNECTIONS);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ppcVar1 = (char **)0x201;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x201,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-asmap=<file>",(allocator<char> *)&local_188);
  tinyformat::format<char_const*>
            (&local_48,
             (tinyformat *)
             "Specify asn mapping used for bucketing of the peers (default: %s). Relative paths will be prefixed by the net-specific datadir location."
             ,(char *)&DEFAULT_ASMAP_FILENAME,ppcVar1);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-bantime=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int>
            (&local_48,"Default duration (in seconds) of manually configured bans (default: %u)",
             &DEFAULT_MISBEHAVING_BANTIME);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-bind=<addr>[:<port>][=onion]",&local_231);
  local_1a8._M_dataplus._M_p._0_2_ =
       *(undefined2 *)
        ((long)testnetBaseParams._M_t.
               super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t.
               super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
               super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl + 2);
  local_1c8._M_dataplus._M_p._0_4_ =
       CONCAT22(local_1c8._M_dataplus._M_p._2_2_,
                *(undefined2 *)
                 ((long)testnet4BaseParams._M_t.
                        super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>
                        .super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl + 2));
  local_188._M_dataplus._M_p._0_2_ =
       *(undefined2 *)
        ((long)defaultBaseParams._M_t.
               super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t.
               super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
               super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl + 2);
  local_238._0_2_ =
       *(undefined2 *)
        ((long)signetBaseParams._M_t.
               super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t.
               super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
               super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl + 2);
  tinyformat::format<unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_short>
            (&local_48,
             (tinyformat *)
             "Bind to given address and always listen on it (default: 0.0.0.0). Use [host]:port notation for IPv6. Append =onion to tag any incoming connections to that address and port as incoming Tor connections (default: 127.0.0.1:%u=onion, testnet3: 127.0.0.1:%u=onion, testnet4: 127.0.0.1:%u=onion, signet: 127.0.0.1:%u=onion, regtest: 127.0.0.1:%u=onion)"
             ,(char *)&local_188,(unsigned_short *)&local_1a8,(unsigned_short *)&local_1c8,
             (unsigned_short *)&local_238,(unsigned_short *)&stack0xfffffffffffffdc6,
             (unsigned_short *)
             CONCAT26(*(undefined2 *)
                       ((long)regtestBaseParams._M_t.
                              super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>
                              .super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl + 2),
                      in_stack_fffffffffffffdc0));
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x201,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-cjdnsreachable",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "If set, then this host is configured for CJDNS (connecting to fc00::/8 addresses would lead us to the CJDNS network, see doc/cjdns.md) (default: 0)"
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-connect=<ip>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Connect only to the specified node; -noconnect disables automatic connections (the rules for this peer are the same as for -addnode). This option can be specified multiple times to connect to multiple nodes."
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x201,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-discover",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Discover own IP addresses (default: 1 when listening and no -externalip or -proxy)",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-dns",(allocator<char> *)&local_188);
  tinyformat::format<int>
            (&local_48,"Allow DNS lookups for -addnode, -seednode and -connect (default: %u)",
             &DEFAULT_NAME_LOOKUP);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-dnsseed",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Query for peer addresses via DNS lookup, if low on addresses (default: %u unless -connect used or -maxconnections=0)"
             ,(bool *)&DEFAULT_DNSSEED);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-externalip=<ip>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Specify your own public address",(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-fixedseeds",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Allow fixed seeds if DNS seeds don\'t provide peers (default: %u)",
             &DEFAULT_FIXEDSEEDS);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-forcednsseed",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Always query for peer addresses via DNS lookup (default: %u)",
             (bool *)&DEFAULT_FORCEDNSSEED);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-listen",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Accept connections from outside (default: %u if no -proxy, -connect or -maxconnections=0)"
             ,(bool *)&DEFAULT_LISTEN);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-listenonion",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Automatically create Tor onion service (default: %d)",
             (bool *)&DEFAULT_LISTEN_ONION);
  psVar4 = &local_168;
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-maxconnections=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int,int>
            (&local_48,
             (tinyformat *)
             "Maintain at most <n> automatic connections to peers (default: %u). This limit does not apply to connections manually added via -addnode or the addnode RPC, which have a separate limit of %u."
             ,"}",&MAX_ADDNODE_CONNECTIONS,(int *)psVar4);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-maxreceivebuffer=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_long>
            (&local_48,"Maximum per-connection receive buffer, <n>*1000 bytes (default: %u)",
             &DEFAULT_MAXRECEIVEBUFFER);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-maxsendbuffer=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_long>
            (&local_48,
             "Maximum per-connection memory usage for the send buffer, <n>*1000 bytes (default: %u)"
             ,&DEFAULT_MAXSENDBUFFER);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-maxuploadtarget=<n>",(allocator<char> *)&local_188);
  tinyformat::format<std::__cxx11::string>
            (&local_48,
             (tinyformat *)
             "Tries to keep outbound traffic under the given target per 24h. Limit does not apply to peers with \'download\' permission or blocks created within past week. 0 = no limit (default: %s). Optional suffix units [k|K|m|M|g|G|t|T] (default: M). Lowercase is 1000 base while uppercase is 1024 base"
             ,(char *)&DEFAULT_MAX_UPLOAD_TARGET_abi_cxx11_,pbVar2);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-onion=<ip:port|path>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Use separate SOCKS5 proxy to reach peers via Tor onion services, set -noonion to disable (default: -proxy). May be a local file path prefixed with \'unix:\'."
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-i2psam=<ip:port>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "I2P SAM proxy to reach I2P peers and accept I2P connections (default: none)",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-i2pacceptincoming",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Whether to accept inbound I2P connections (default: %i). Ignored if -i2psam is not set. Listening for inbound I2P connections is done through the SAM proxy, not by binding to a local address and port."
             ,(bool *)&DEFAULT_I2P_ACCEPT_INCOMING);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-onlynet=<net>",(allocator<char> *)&local_238);
  GetNetworkNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1a8,false);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_188,(util *)&local_1a8,", ");
  std::operator+(&local_168,"Make automatic outbound connections only to network <net> (",&local_188
                );
  std::operator+(&local_48,&local_168,
                 "). Inbound and manual connections are not affected by this option. It can be specified multiple times to allow multiple networks."
                );
  local_1c8._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-v2transport",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Support v2 transport (default: %u)",(bool *)&DEFAULT_V2_TRANSPORT);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-peerbloomfilters",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Support filtering of blocks and transaction with bloom filters (default: %u)",
             (bool *)&DEFAULT_PEERBLOOMFILTERS);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-peerblockfilters",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Serve compact block filters to peers per BIP 157 (default: %u)",
             (bool *)&DEFAULT_PEERBLOCKFILTERS);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-txreconciliation",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Enable transaction reconciliations per BIP 330 (default: %d)",
             (bool *)&DEFAULT_TXRECONCILIATION_ENABLE);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"-port=<port>",&local_231)
  ;
  local_188._M_dataplus._M_p._0_4_ =
       CONCAT22(local_188._M_dataplus._M_p._2_2_,
                *(undefined2 *)
                 ((long)defaultChainParams._M_t.
                        super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                        .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x174));
  local_1a8._M_dataplus._M_p._0_4_ =
       CONCAT22(local_1a8._M_dataplus._M_p._2_2_,
                *(undefined2 *)
                 ((long)testnetChainParams._M_t.
                        super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                        .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x174));
  local_1c8._M_dataplus._M_p._0_4_ =
       CONCAT22(local_1c8._M_dataplus._M_p._2_2_,
                *(undefined2 *)
                 ((long)testnet4ChainParams._M_t.
                        super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                        .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x174));
  local_238._0_2_ =
       *(undefined2 *)
        ((long)signetChainParams._M_t.
               super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>.
               _M_t.
               super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
               .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x174);
  pOVar3 = &local_238;
  tinyformat::format<unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_short>
            (&local_48,
             (tinyformat *)
             "Listen for connections on <port> (default: %u, testnet3: %u, testnet4: %u, signet: %u, regtest: %u). Not relevant for I2P (see doc/i2p.md)."
             ,(char *)&local_188,(unsigned_short *)&local_1a8,(unsigned_short *)&local_1c8,
             (unsigned_short *)pOVar3,(unsigned_short *)&stack0xfffffffffffffdc6,
             (unsigned_short *)
             CONCAT26(*(undefined2 *)
                       ((long)regtestChainParams._M_t.
                              super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                              .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl +
                       0x174),in_stack_fffffffffffffdc0));
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x201,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-proxy=<ip:port|path>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Connect through SOCKS5 proxy, set -noproxy to disable (default: disabled). May be a local file path prefixed with \'unix:\' if the proxy supports it."
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x41,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-proxyrandomize",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Randomize credentials for every proxy connection. This enables Tor stream isolation (default: %u)"
             ,(bool *)&DEFAULT_PROXYRANDOMIZE);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-seednode=<ip>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Connect to a node to retrieve peer addresses, and disconnect. This option can be specified multiple times to connect to multiple nodes. During startup, seednodes will be tried before dnsseeds."
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-networkactive",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Enable all P2P network activity (default: 1). Can be changed by the setnetworkactive RPC command"
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-timeout=<n>",(allocator<char> *)&local_188);
  tinyformat::format<int>
            (&local_48,
             "Specify socket connection timeout in milliseconds. If an initial attempt to connect is unsuccessful after this amount of time, drop it (minimum: 1, default: %d)"
             ,&DEFAULT_CONNECT_TIMEOUT);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-peertimeout=<n>",(allocator<char> *)&local_188);
  tinyformat::format<long>
            (&local_48,
             "Specify a p2p connection timeout delay in seconds. After connecting to a peer, wait this amount of time before considering disconnection based on inactivity (minimum: 1, default: %d)"
             ,&DEFAULT_PEER_CONNECT_TIMEOUT);
  psVar4 = &local_168;
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-torcontrol=<ip>:<port>",(allocator<char> *)&local_188);
  tinyformat::format<std::__cxx11::string,int>
            (&local_48,
             (tinyformat *)
             "Tor control host and port to use if onion listening enabled (default: %s). If no port is specified, the default port of %i will be used."
             ,(char *)&DEFAULT_TOR_CONTROL_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DEFAULT_TOR_CONTROL_PORT,(int *)psVar4);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-torpassword=<pass>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Tor control port password (default: empty)",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x401,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[6]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hidden_args,
             (char (*) [6])"-upnp");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[8]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hidden_args,
             (char (*) [8])"-natpmp");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-whitebind=<[permissions@]addr>",(allocator<char> *)&local_1c8);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_188,(util *)&NET_PERMISSIONS_DOC_abi_cxx11_,", ");
  std::operator+(&local_168,
                 "Bind to the given address and add permission flags to the peers connecting to it. Use [host]:port notation for IPv6. Allowed permissions: "
                 ,&local_188);
  std::operator+(&local_48,&local_168,
                 ". Specify multiple permissions separated by commas (default: download,noban,mempool,relay). Can be specified multiple times."
                );
  local_1a8._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-whitelist=<[permissions@]IP address or network>",
             (allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Add permission flags to the peers using the given IP address (e.g. 1.2.3.4) or CIDR-notated network (e.g. 1.2.3.0/24). Uses the same permissions as -whitebind. Additional flags \"in\" and \"out\" control whether permissions apply to incoming connections and/or manual (default: incoming only). Can be specified multiple times."
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  (*g_wallet_init_interface->_vptr_WalletInitInterface[1])(g_wallet_init_interface,argsman);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[27]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hidden_args,
             (char (*) [27])"-zmqpubhashblock=<address>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[24]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hidden_args,
             (char (*) [24])"-zmqpubhashtx=<address>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[26]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hidden_args,
             (char (*) [26])"-zmqpubrawblock=<address>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[23]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hidden_args,
             (char (*) [23])"-zmqpubrawtx=<address>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[20]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hidden_args,
             (char (*) [20])"-zmqpubsequence=<n>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[24]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hidden_args,
             (char (*) [24])"-zmqpubhashblockhwm=<n>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[21]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hidden_args,
             (char (*) [21])"-zmqpubhashtxhwm=<n>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[23]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hidden_args,
             (char (*) [23])"-zmqpubrawblockhwm=<n>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[20]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hidden_args,
             (char (*) [20])"-zmqpubrawtxhwm=<n>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[23]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hidden_args,
             (char (*) [23])"-zmqpubsequencehwm=<n>");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-checkblocks=<n>",(allocator<char> *)&local_188);
  tinyformat::format<int>
            (&local_48,"How many blocks to check at startup (default: %u, 0 = all)",
             &DEFAULT_CHECKBLOCKS);
  psVar4 = &local_168;
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-checklevel=<n>",(allocator<char> *)&local_1a8);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_168,(util *)&CHECKLEVEL_DOC_abi_cxx11_,", ");
  tinyformat::format<std::__cxx11::string,int>
            (&local_48,
             (tinyformat *)
             "How thorough the block verification of -checkblocks is: %s (0-4, default: %u)",
             (char *)&local_168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DEFAULT_CHECKLEVEL,(int *)psVar4);
  psVar4 = &local_188;
  local_188._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-checkblockindex",(allocator<char> *)&local_188);
  local_1a8._M_dataplus._M_p._0_1_ =
       *(undefined1 *)
        ((long)defaultChainParams._M_t.
               super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>.
               _M_t.
               super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
               .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x2d0);
  local_1c8._M_dataplus._M_p._0_1_ =
       *(undefined1 *)
        ((long)regtestChainParams._M_t.
               super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>.
               _M_t.
               super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
               .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x2d0);
  tinyformat::format<bool,bool>
            (&local_48,
             (tinyformat *)
             "Do a consistency check for the block tree, chainstate, and other validation data structures every <n> operations. Use 0 to disable. (default: %u, regtest: %u)"
             ,(char *)&local_1a8,(bool *)&local_1c8,(bool *)psVar4);
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-checkaddrman=<n>",(allocator<char> *)&local_188);
  tinyformat::format<int>
            (&local_48,
             "Run addrman consistency checks every <n> operations. Use 0 to disable. (default: %u)",
             &DEFAULT_ADDRMAN_CONSISTENCY_CHECKS);
  psVar4 = &local_168;
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-checkmempool=<n>",(allocator<char> *)&local_188);
  local_1a8._M_dataplus._M_p._0_4_ =
       CONCAT31(local_1a8._M_dataplus._M_p._1_3_,
                *(undefined1 *)
                 ((long)defaultChainParams._M_t.
                        super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                        .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x2d0));
  local_1c8._M_dataplus._M_p._0_4_ =
       CONCAT31(local_1c8._M_dataplus._M_p._1_3_,
                *(undefined1 *)
                 ((long)regtestChainParams._M_t.
                        super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                        .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x2d0));
  tinyformat::format<bool,bool>
            (&local_48,
             (tinyformat *)
             "Run mempool consistency checks every <n> transactions. Use 0 to disable. (default: %u, regtest: %u)"
             ,(char *)&local_1a8,(bool *)&local_1c8,(bool *)psVar4);
  psVar4 = &local_168;
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-checkpoints",(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ =
       CCheckpointData::GetHeight
                 ((CCheckpointData *)
                  ((long)defaultChainParams._M_t.
                         super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                         .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x2d8));
  tinyformat::format<int,bool>
            (&local_48,
             (tinyformat *)
             "Enable rejection of any forks from the known historical chain until block %s (default: %u)"
             ,(char *)&local_168,(int *)&DEFAULT_CHECKPOINTS_ENABLED,(bool *)psVar4);
  local_188._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_188);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-deprecatedrpc=<method>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Allows deprecated RPC method(s) to be used",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-stopafterblockimport",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Stop running after importing blocks from disk (default: %u)",
             &DEFAULT_STOPAFTERBLOCKIMPORT);
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-stopatheight",(allocator<char> *)&local_188);
  tinyformat::format<int>
            (&local_48,
             "Stop running after reaching the given height in the main chain (default: %u)",
             &node::DEFAULT_STOPATHEIGHT);
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-limitancestorcount=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int>
            (&local_48,
             "Do not accept transactions if number of in-mempool ancestors is <n> or more (default: %u)"
             ,&DEFAULT_ANCESTOR_LIMIT);
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-limitancestorsize=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int>
            (&local_48,
             "Do not accept transactions whose size with all in-mempool ancestors exceeds <n> kilobytes (default: %u)"
             ,&DEFAULT_ANCESTOR_SIZE_LIMIT_KVB);
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-limitdescendantcount=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int>
            (&local_48,
             "Do not accept transactions if any ancestor would have <n> or more in-mempool descendants (default: %u)"
             ,&DEFAULT_DESCENDANT_LIMIT);
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-limitdescendantsize=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int>
            (&local_48,
             "Do not accept transactions if any ancestor would have more than <n> kilobytes of in-mempool descendants (default: %u)."
             ,&DEFAULT_DESCENDANT_SIZE_LIMIT_KVB);
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-test=<option>",(allocator<char> *)&local_1c8);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_188,(util *)&TEST_OPTIONS_DOC_abi_cxx11_,", ");
  std::operator+(&local_168,"Pass a test-only option. Options include : ",&local_188);
  std::operator+(&local_48,&local_168,".");
  local_1a8._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-capturemessages",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Capture all P2P messages to disk",(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-mocktime=<n>",(allocator<char> *)&local_1a8);
  std::operator+(&local_168,"Replace actual time with ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_48,&local_168," (default: 0)");
  local_188._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_188);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-maxsigcachesize=<n>",(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p = (pointer)0x20;
  tinyformat::format<unsigned_long>
            (&local_48,
             "Limit sum of signature cache and script execution cache sizes to <n> MiB (default: %u)"
             ,(unsigned_long *)&local_168);
  local_188._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_188);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-maxtipage=<n>",(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p = (pointer)0x15180;
  tinyformat::format<long>
            (&local_48,
             "Maximum tip age in seconds to consider node in initial block download (default: %u)",
             (long *)&local_168);
  local_188._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_188);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-printpriority",(allocator<char> *)&local_1c8);
  std::operator+(&local_188,"Log transaction fee rate in ",&CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_168,&local_188,"/kvB when mining blocks (default: %u)");
  tinyformat::format<bool>(&local_48,&local_168,(bool *)&node::DEFAULT_PRINT_MODIFIED_FEE);
  local_1a8._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-uacomment=<cmt>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Append comment to the user agent string",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  SetupChainParamsBaseOptions(argsman);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-acceptnonstdtxn",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Relay and mine \"non-standard\" transactions (test networks only; default: %u)",
             &DEFAULT_ACCEPT_NON_STD_TXN);
  psVar4 = &local_168;
  local_168._M_dataplus._M_p._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-incrementalrelayfee=<amt>",(allocator<char> *)&local_1a8);
  FormatMoney_abi_cxx11_(&local_168,1000);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_48,
             (tinyformat *)
             "Fee rate (in %s/kvB) used to define cost of relay, used for mempool limiting and replacement policy. (default: %s)"
             ,(char *)&CURRENCY_UNIT_abi_cxx11_,&local_168,psVar4);
  psVar4 = &local_188;
  local_188._M_dataplus._M_p._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-dustrelayfee=<amt>",(allocator<char> *)&local_1a8);
  FormatMoney_abi_cxx11_(&local_168,3000);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_48,
             (tinyformat *)
             "Fee rate (in %s/kvB) used to define dust, the value of an output such that it will cost more than its value in fees at this fee rate to spend it. (default: %s)"
             ,(char *)&CURRENCY_UNIT_abi_cxx11_,&local_168,psVar4);
  local_188._M_dataplus._M_p._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_188);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-acceptstalefeeestimates",(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p = (pointer)0x3c;
  tinyformat::format<char[15],bool,long>
            (&local_48,
             (tinyformat *)
             "Read fee estimates even if they are stale (%sdefault: %u) fee estimates are considered stale if they are %s hours old"
             ,"regtest only; ",(char (*) [15])&DEFAULT_ACCEPT_STALE_FEE_ESTIMATES,(bool *)&local_168
             ,(long *)pOVar3);
  local_188._M_dataplus._M_p._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_188);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-bytespersigop",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int>
            (&local_48,
             "Equivalent bytes per sigop in transactions for relay and mining (default: %u)",
             &DEFAULT_BYTES_PER_SIGOP);
  local_168._M_dataplus._M_p._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-datacarrier",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Relay and mine data carrier transactions (default: %u)",
             (bool *)&DEFAULT_ACCEPT_DATACARRIER);
  local_168._M_dataplus._M_p._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-datacarriersize",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int>
            (&local_48,
             "Relay and mine transactions whose data-carrying raw scriptPubKey is of this size or less (default: %u)"
             ,&MAX_OP_RETURN_RELAY);
  local_168._M_dataplus._M_p._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-mempoolfullrbf",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "(DEPRECATED) Accept transaction replace-by-fee without requiring replaceability signaling (default: %u)"
             ,(bool *)&DEFAULT_MEMPOOL_FULL_RBF);
  local_168._M_dataplus._M_p._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-permitbaremultisig",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Relay transactions creating non-P2SH multisig outputs (default: %u)",
             (bool *)&DEFAULT_PERMIT_BAREMULTISIG);
  psVar4 = &local_168;
  local_168._M_dataplus._M_p._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-minrelaytxfee=<amt>",(allocator<char> *)&local_1a8);
  FormatMoney_abi_cxx11_(&local_168,1000);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_48,
             (tinyformat *)
             "Fees (in %s/kvB) smaller than this are considered zero fee for relaying, mining and transaction creation (default: %s)"
             ,(char *)&CURRENCY_UNIT_abi_cxx11_,&local_168,psVar4);
  local_188._M_dataplus._M_p._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_188);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-whitelistforcerelay",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Add \'forcerelay\' permission to whitelisted peers with default permissions. This will relay transactions even if the transactions were already in the mempool. (default: %d)"
             ,(bool *)&DEFAULT_WHITELISTFORCERELAY);
  local_168._M_dataplus._M_p._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-whitelistrelay",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Add \'relay\' permission to whitelisted peers with default permissions. This will accept relayed transactions even when not relaying transactions (default: %d)"
             ,(bool *)&DEFAULT_WHITELISTRELAY);
  local_168._M_dataplus._M_p._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-blockmaxweight=<n>",(allocator<char> *)&local_188);
  tinyformat::format<unsigned_int>
            (&local_48,"Set maximum BIP141 block weight (default: %d)",&DEFAULT_BLOCK_MAX_WEIGHT);
  psVar4 = &local_168;
  local_168._M_dataplus._M_p._0_4_ = 8;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-blockmintxfee=<amt>",(allocator<char> *)&local_1a8);
  FormatMoney_abi_cxx11_(&local_168,1000);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_48,
             (tinyformat *)
             "Set lowest fee rate (in %s/kvB) for transactions to be included in block creation. (default: %s)"
             ,(char *)&CURRENCY_UNIT_abi_cxx11_,&local_168,psVar4);
  local_188._M_dataplus._M_p._0_4_ = 8;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_188);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-blockversion=<n>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Override block version to test forking scenarios",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 8;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rest",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Accept public REST requests (default: %u)",&DEFAULT_REST_ENABLE);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpcallowip=<ip>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Allow JSON-RPC connections from specified source. Valid values for <ip> are a single IP (e.g. 1.2.3.4), a network/netmask (e.g. 1.2.3.4/255.255.255.0), a network/CIDR (e.g. 1.2.3.4/24), all ipv4 (0.0.0.0/0), or all ipv6 (::/0). This option can be specified multiple times"
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpcauth=<userpw>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Username and HMAC-SHA-256 hashed password for JSON-RPC connections. The field <userpw> comes in the format: <USERNAME>:<SALT>$<HASH>. A canonical python script is included in share/rpcauth. The client then connects normally using the rpcuser=<USERNAME>/rpcpassword=<PASSWORD> pair of arguments. This option can be specified multiple times"
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x401,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpcbind=<addr>[:port]",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Bind to given address to listen for JSON-RPC connections. Do not expose the RPC server to untrusted networks such as the public internet! This option is ignored unless -rpcallowip is also passed. Port is optional and overrides -rpcport. Use [host]:port notation for IPv6. This option can be specified multiple times (default: 127.0.0.1 and ::1 i.e., localhost)"
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x201,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpcdoccheck",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Throw a non-fatal error at runtime if the documentation for an RPC is incorrect (default: %u)"
             ,&DEFAULT_RPC_DOC_CHECK);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpccookiefile=<loc>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Location of the auth cookie. Relative paths will be prefixed by a net-specific datadir location. (default: data dir)"
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpccookieperms=<readable-by>",(allocator<char> *)&local_188);
  tinyformat::format<>
            (&local_48,
             "Set permissions on the RPC auth cookie file so that it is readable by [owner|group|all] (default: owner [via umask 0077])"
            );
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpcpassword=<pw>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Password for JSON-RPC connections",(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x401,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpcport=<port>",&local_231);
  local_188._M_dataplus._M_p._0_4_ =
       CONCAT22(local_188._M_dataplus._M_p._2_2_,
                *(undefined2 *)
                 defaultBaseParams._M_t.
                 super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
                 super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl);
  local_1a8._M_dataplus._M_p._0_4_ =
       CONCAT22(local_1a8._M_dataplus._M_p._2_2_,
                *(undefined2 *)
                 testnetBaseParams._M_t.
                 super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
                 super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl);
  local_1c8._M_dataplus._M_p._0_4_ =
       CONCAT22(local_1c8._M_dataplus._M_p._2_2_,
                *(undefined2 *)
                 testnet4BaseParams._M_t.
                 super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
                 super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl);
  local_238 = CONCAT22(local_238._2_2_,
                       *(undefined2 *)
                        signetBaseParams._M_t.
                        super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>
                        .super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl);
  tinyformat::format<unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_short>
            (&local_48,
             (tinyformat *)
             "Listen for JSON-RPC connections on <port> (default: %u, testnet3: %u, testnet4: %u, signet: %u, regtest: %u)"
             ,(char *)&local_188,(unsigned_short *)&local_1a8,(unsigned_short *)&local_1c8,
             (unsigned_short *)&local_238,(unsigned_short *)&stack0xfffffffffffffdc6,
             (unsigned_short *)
             CONCAT26(*(undefined2 *)
                       regtestBaseParams._M_t.
                       super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>
                       .super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl,
                      in_stack_fffffffffffffdc0));
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x201,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpcservertimeout=<n>",(allocator<char> *)&local_188);
  tinyformat::format<int>
            (&local_48,"Timeout during HTTP requests (default: %d)",&DEFAULT_HTTP_SERVER_TIMEOUT);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpcthreads=<n>",(allocator<char> *)&local_188);
  tinyformat::format<int>
            (&local_48,"Set the number of threads to service RPC calls (default: %d)",
             &DEFAULT_HTTP_THREADS);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpcuser=<user>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Username for JSON-RPC connections",(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x401,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpcwhitelist=<whitelist>",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Set a whitelist to filter incoming RPC calls for a specific user. The field <whitelist> comes in the format: <USERNAME>:<rpc 1>,<rpc 2>,...,<rpc n>. If multiple whitelists are set for a given user, they are set-intersected. See -rpcwhitelistdefault documentation for information on default whitelist behavior."
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpcwhitelistdefault",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Sets default behavior for rpc whitelisting. Unless rpcwhitelistdefault is set to 0, if any -rpcwhitelist is set, the rpc server acts as if all rpc users are subject to empty-unless-otherwise-specified whitelists. If rpcwhitelistdefault is set to 1 and no -rpcwhitelist is set, rpc server acts as if all rpc users are subject to empty whitelists."
             ,(allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-rpcworkqueue=<n>",(allocator<char> *)&local_188);
  tinyformat::format<int>
            (&local_48,"Set the depth of the work queue to service RPC calls (default: %d)",
             &DEFAULT_HTTP_WORKQUEUE);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,0x101,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-server",(allocator<char> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Accept command line and JSON-RPC commands",
             (allocator<char> *)&local_1a8);
  local_168._M_dataplus._M_p._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-daemon",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,"Run in the background as a daemon and accept commands (default: %d)",
             &DEFAULT_DAEMON);
  local_168._M_dataplus._M_p._0_4_ = _S_red;
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"-daemonwait",(allocator<char> *)&local_188);
  tinyformat::format<bool>
            (&local_48,
             "Wait for initialization to be finished before exiting. This implies -daemon (default: %d)"
             ,&DEFAULT_DAEMONWAIT);
  local_168._M_dataplus._M_p = (pointer)((ulong)local_168._M_dataplus._M_p._4_4_ << 0x20);
  ArgsManager::AddArg(argsman,&local_148,&local_48,1,(OptionsCategory *)&local_168);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  ArgsManager::AddHiddenArgs(argsman,&hidden_args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&hidden_args);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&regtestChainParams);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&signetChainParams);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&testnet4ChainParams);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&testnetChainParams);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&defaultChainParams);
  std::unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_>::~unique_ptr
            (&regtestBaseParams);
  std::unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_>::~unique_ptr
            (&signetBaseParams);
  std::unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_>::~unique_ptr
            (&testnet4BaseParams);
  std::unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_>::~unique_ptr
            (&testnetBaseParams);
  std::unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_>::~unique_ptr
            (&defaultBaseParams);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == (pointer)local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetupServerArgs(ArgsManager& argsman)
{
    SetupHelpOptions(argsman);
    argsman.AddArg("-help-debug", "Print help message with debugging options and exit", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST); // server-only for now

    init::AddLoggingArgs(argsman);

    const auto defaultBaseParams = CreateBaseChainParams(ChainType::MAIN);
    const auto testnetBaseParams = CreateBaseChainParams(ChainType::TESTNET);
    const auto testnet4BaseParams = CreateBaseChainParams(ChainType::TESTNET4);
    const auto signetBaseParams = CreateBaseChainParams(ChainType::SIGNET);
    const auto regtestBaseParams = CreateBaseChainParams(ChainType::REGTEST);
    const auto defaultChainParams = CreateChainParams(argsman, ChainType::MAIN);
    const auto testnetChainParams = CreateChainParams(argsman, ChainType::TESTNET);
    const auto testnet4ChainParams = CreateChainParams(argsman, ChainType::TESTNET4);
    const auto signetChainParams = CreateChainParams(argsman, ChainType::SIGNET);
    const auto regtestChainParams = CreateChainParams(argsman, ChainType::REGTEST);

    // Hidden Options
    std::vector<std::string> hidden_args = {
        "-dbcrashratio", "-forcecompactdb",
        // GUI args. These will be overwritten by SetupUIArgs for the GUI
        "-choosedatadir", "-lang=<lang>", "-min", "-resetguisettings", "-splash", "-uiplatform"};

    argsman.AddArg("-version", "Print version and exit", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
#if HAVE_SYSTEM
    argsman.AddArg("-alertnotify=<cmd>", "Execute command when an alert is raised (%s in cmd is replaced by message)", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
#endif
    argsman.AddArg("-assumevalid=<hex>", strprintf("If this block is in the chain assume that it and its ancestors are valid and potentially skip their script verification (0 to verify all, default: %s, testnet3: %s, testnet4: %s, signet: %s)", defaultChainParams->GetConsensus().defaultAssumeValid.GetHex(), testnetChainParams->GetConsensus().defaultAssumeValid.GetHex(), testnet4ChainParams->GetConsensus().defaultAssumeValid.GetHex(), signetChainParams->GetConsensus().defaultAssumeValid.GetHex()), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-blocksdir=<dir>", "Specify directory to hold blocks subdirectory for *.dat files (default: <datadir>)", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-blocksxor",
                   strprintf("Whether an XOR-key applies to blocksdir *.dat files. "
                             "The created XOR-key will be zeros for an existing blocksdir or when `-blocksxor=0` is "
                             "set, and random for a freshly initialized blocksdir. "
                             "(default: %u)",
                             kernel::DEFAULT_XOR_BLOCKSDIR),
                   ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-fastprune", "Use smaller block files and lower minimum prune height for testing purposes", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
#if HAVE_SYSTEM
    argsman.AddArg("-blocknotify=<cmd>", "Execute command when the best block changes (%s in cmd is replaced by block hash)", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
#endif
    argsman.AddArg("-blockreconstructionextratxn=<n>", strprintf("Extra transactions to keep in memory for compact block reconstructions (default: %u)", DEFAULT_BLOCK_RECONSTRUCTION_EXTRA_TXN), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-blocksonly", strprintf("Whether to reject transactions from network peers. Disables automatic broadcast and rebroadcast of transactions, unless the source peer has the 'forcerelay' permission. RPC transactions are not affected. (default: %u)", DEFAULT_BLOCKSONLY), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-coinstatsindex", strprintf("Maintain coinstats index used by the gettxoutsetinfo RPC (default: %u)", DEFAULT_COINSTATSINDEX), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-conf=<file>", strprintf("Specify path to read-only configuration file. Relative paths will be prefixed by datadir location (only useable from command line, not configuration file) (default: %s)", BITCOIN_CONF_FILENAME), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-datadir=<dir>", "Specify data directory", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-dbbatchsize", strprintf("Maximum database write batch size in bytes (default: %u)", nDefaultDbBatchSize), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::OPTIONS);
    argsman.AddArg("-dbcache=<n>", strprintf("Maximum database cache size <n> MiB (%d to %d, default: %d). In addition, unused mempool memory is shared for this cache (see -maxmempool).", nMinDbCache, nMaxDbCache, nDefaultDbCache), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-includeconf=<file>", "Specify additional configuration file, relative to the -datadir path (only useable from configuration file, not command line)", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-allowignoredconf", strprintf("For backwards compatibility, treat an unused %s file in the datadir as a warning, not an error.", BITCOIN_CONF_FILENAME), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-loadblock=<file>", "Imports blocks from external file on startup", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-maxmempool=<n>", strprintf("Keep the transaction memory pool below <n> megabytes (default: %u)", DEFAULT_MAX_MEMPOOL_SIZE_MB), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-maxorphantx=<n>", strprintf("Keep at most <n> unconnectable transactions in memory (default: %u)", DEFAULT_MAX_ORPHAN_TRANSACTIONS), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-mempoolexpiry=<n>", strprintf("Do not keep transactions in the mempool longer than <n> hours (default: %u)", DEFAULT_MEMPOOL_EXPIRY_HOURS), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-minimumchainwork=<hex>", strprintf("Minimum work assumed to exist on a valid chain in hex (default: %s, testnet3: %s, testnet4: %s, signet: %s)", defaultChainParams->GetConsensus().nMinimumChainWork.GetHex(), testnetChainParams->GetConsensus().nMinimumChainWork.GetHex(), testnet4ChainParams->GetConsensus().nMinimumChainWork.GetHex(), signetChainParams->GetConsensus().nMinimumChainWork.GetHex()), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::OPTIONS);
    argsman.AddArg("-par=<n>", strprintf("Set the number of script verification threads (0 = auto, up to %d, <0 = leave that many cores free, default: %d)",
        MAX_SCRIPTCHECK_THREADS, DEFAULT_SCRIPTCHECK_THREADS), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-persistmempool", strprintf("Whether to save the mempool on shutdown and load on restart (default: %u)", DEFAULT_PERSIST_MEMPOOL), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-persistmempoolv1",
                   strprintf("Whether a mempool.dat file created by -persistmempool or the savemempool RPC will be written in the legacy format "
                             "(version 1) or the current format (version 2). This temporary option will be removed in the future. (default: %u)",
                             DEFAULT_PERSIST_V1_DAT),
                   ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-pid=<file>", strprintf("Specify pid file. Relative paths will be prefixed by a net-specific datadir location. (default: %s)", BITCOIN_PID_FILENAME), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-prune=<n>", strprintf("Reduce storage requirements by enabling pruning (deleting) of old blocks. This allows the pruneblockchain RPC to be called to delete specific blocks and enables automatic pruning of old blocks if a target size in MiB is provided. This mode is incompatible with -txindex. "
            "Warning: Reverting this setting requires re-downloading the entire blockchain. "
            "(default: 0 = disable pruning blocks, 1 = allow manual pruning via RPC, >=%u = automatically prune block files to stay under the specified target size in MiB)", MIN_DISK_SPACE_FOR_BLOCK_FILES / 1024 / 1024), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-reindex", "If enabled, wipe chain state and block index, and rebuild them from blk*.dat files on disk. Also wipe and rebuild other optional indexes that are active. If an assumeutxo snapshot was loaded, its chainstate will be wiped as well. The snapshot can then be reloaded via RPC.", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-reindex-chainstate", "If enabled, wipe chain state, and rebuild it from blk*.dat files on disk. If an assumeutxo snapshot was loaded, its chainstate will be wiped as well. The snapshot can then be reloaded via RPC.", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-settings=<file>", strprintf("Specify path to dynamic settings data file. Can be disabled with -nosettings. File is written at runtime and not meant to be edited by users (use %s instead for custom settings). Relative paths will be prefixed by datadir location. (default: %s)", BITCOIN_CONF_FILENAME, BITCOIN_SETTINGS_FILENAME), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
#if HAVE_SYSTEM
    argsman.AddArg("-startupnotify=<cmd>", "Execute command on startup.", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-shutdownnotify=<cmd>", "Execute command immediately before beginning shutdown. The need for shutdown may be urgent, so be careful not to delay it long (if the command doesn't require interaction with the server, consider having it fork into the background).", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
#endif
    argsman.AddArg("-txindex", strprintf("Maintain a full transaction index, used by the getrawtransaction rpc call (default: %u)", DEFAULT_TXINDEX), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-blockfilterindex=<type>",
                 strprintf("Maintain an index of compact filters by block (default: %s, values: %s).", DEFAULT_BLOCKFILTERINDEX, ListBlockFilterTypes()) +
                 " If <type> is not supplied or if <type> = 1, indexes for all known types are enabled.",
                 ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);

    argsman.AddArg("-addnode=<ip>", strprintf("Add a node to connect to and attempt to keep the connection open (see the addnode RPC help for more info). This option can be specified multiple times to add multiple nodes; connections are limited to %u at a time and are counted separately from the -maxconnections limit.", MAX_ADDNODE_CONNECTIONS), ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::CONNECTION);
    argsman.AddArg("-asmap=<file>", strprintf("Specify asn mapping used for bucketing of the peers (default: %s). Relative paths will be prefixed by the net-specific datadir location.", DEFAULT_ASMAP_FILENAME), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-bantime=<n>", strprintf("Default duration (in seconds) of manually configured bans (default: %u)", DEFAULT_MISBEHAVING_BANTIME), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-bind=<addr>[:<port>][=onion]", strprintf("Bind to given address and always listen on it (default: 0.0.0.0). Use [host]:port notation for IPv6. Append =onion to tag any incoming connections to that address and port as incoming Tor connections (default: 127.0.0.1:%u=onion, testnet3: 127.0.0.1:%u=onion, testnet4: 127.0.0.1:%u=onion, signet: 127.0.0.1:%u=onion, regtest: 127.0.0.1:%u=onion)", defaultBaseParams->OnionServiceTargetPort(), testnetBaseParams->OnionServiceTargetPort(), testnet4BaseParams->OnionServiceTargetPort(), signetBaseParams->OnionServiceTargetPort(), regtestBaseParams->OnionServiceTargetPort()), ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::CONNECTION);
    argsman.AddArg("-cjdnsreachable", "If set, then this host is configured for CJDNS (connecting to fc00::/8 addresses would lead us to the CJDNS network, see doc/cjdns.md) (default: 0)", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-connect=<ip>", "Connect only to the specified node; -noconnect disables automatic connections (the rules for this peer are the same as for -addnode). This option can be specified multiple times to connect to multiple nodes.", ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::CONNECTION);
    argsman.AddArg("-discover", "Discover own IP addresses (default: 1 when listening and no -externalip or -proxy)", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-dns", strprintf("Allow DNS lookups for -addnode, -seednode and -connect (default: %u)", DEFAULT_NAME_LOOKUP), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-dnsseed", strprintf("Query for peer addresses via DNS lookup, if low on addresses (default: %u unless -connect used or -maxconnections=0)", DEFAULT_DNSSEED), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-externalip=<ip>", "Specify your own public address", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-fixedseeds", strprintf("Allow fixed seeds if DNS seeds don't provide peers (default: %u)", DEFAULT_FIXEDSEEDS), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-forcednsseed", strprintf("Always query for peer addresses via DNS lookup (default: %u)", DEFAULT_FORCEDNSSEED), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-listen", strprintf("Accept connections from outside (default: %u if no -proxy, -connect or -maxconnections=0)", DEFAULT_LISTEN), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-listenonion", strprintf("Automatically create Tor onion service (default: %d)", DEFAULT_LISTEN_ONION), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-maxconnections=<n>", strprintf("Maintain at most <n> automatic connections to peers (default: %u). This limit does not apply to connections manually added via -addnode or the addnode RPC, which have a separate limit of %u.", DEFAULT_MAX_PEER_CONNECTIONS, MAX_ADDNODE_CONNECTIONS), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-maxreceivebuffer=<n>", strprintf("Maximum per-connection receive buffer, <n>*1000 bytes (default: %u)", DEFAULT_MAXRECEIVEBUFFER), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-maxsendbuffer=<n>", strprintf("Maximum per-connection memory usage for the send buffer, <n>*1000 bytes (default: %u)", DEFAULT_MAXSENDBUFFER), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-maxuploadtarget=<n>", strprintf("Tries to keep outbound traffic under the given target per 24h. Limit does not apply to peers with 'download' permission or blocks created within past week. 0 = no limit (default: %s). Optional suffix units [k|K|m|M|g|G|t|T] (default: M). Lowercase is 1000 base while uppercase is 1024 base", DEFAULT_MAX_UPLOAD_TARGET), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
#ifdef HAVE_SOCKADDR_UN
    argsman.AddArg("-onion=<ip:port|path>", "Use separate SOCKS5 proxy to reach peers via Tor onion services, set -noonion to disable (default: -proxy). May be a local file path prefixed with 'unix:'.", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
#else
    argsman.AddArg("-onion=<ip:port>", "Use separate SOCKS5 proxy to reach peers via Tor onion services, set -noonion to disable (default: -proxy)", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
#endif
    argsman.AddArg("-i2psam=<ip:port>", "I2P SAM proxy to reach I2P peers and accept I2P connections (default: none)", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-i2pacceptincoming", strprintf("Whether to accept inbound I2P connections (default: %i). Ignored if -i2psam is not set. Listening for inbound I2P connections is done through the SAM proxy, not by binding to a local address and port.", DEFAULT_I2P_ACCEPT_INCOMING), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-onlynet=<net>", "Make automatic outbound connections only to network <net> (" + Join(GetNetworkNames(), ", ") + "). Inbound and manual connections are not affected by this option. It can be specified multiple times to allow multiple networks.", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-v2transport", strprintf("Support v2 transport (default: %u)", DEFAULT_V2_TRANSPORT), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-peerbloomfilters", strprintf("Support filtering of blocks and transaction with bloom filters (default: %u)", DEFAULT_PEERBLOOMFILTERS), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-peerblockfilters", strprintf("Serve compact block filters to peers per BIP 157 (default: %u)", DEFAULT_PEERBLOCKFILTERS), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-txreconciliation", strprintf("Enable transaction reconciliations per BIP 330 (default: %d)", DEFAULT_TXRECONCILIATION_ENABLE), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::CONNECTION);
    argsman.AddArg("-port=<port>", strprintf("Listen for connections on <port> (default: %u, testnet3: %u, testnet4: %u, signet: %u, regtest: %u). Not relevant for I2P (see doc/i2p.md).", defaultChainParams->GetDefaultPort(), testnetChainParams->GetDefaultPort(), testnet4ChainParams->GetDefaultPort(), signetChainParams->GetDefaultPort(), regtestChainParams->GetDefaultPort()), ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::CONNECTION);
#ifdef HAVE_SOCKADDR_UN
    argsman.AddArg("-proxy=<ip:port|path>", "Connect through SOCKS5 proxy, set -noproxy to disable (default: disabled). May be a local file path prefixed with 'unix:' if the proxy supports it.", ArgsManager::ALLOW_ANY | ArgsManager::DISALLOW_ELISION, OptionsCategory::CONNECTION);
#else
    argsman.AddArg("-proxy=<ip:port>", "Connect through SOCKS5 proxy, set -noproxy to disable (default: disabled)", ArgsManager::ALLOW_ANY | ArgsManager::DISALLOW_ELISION, OptionsCategory::CONNECTION);
#endif
    argsman.AddArg("-proxyrandomize", strprintf("Randomize credentials for every proxy connection. This enables Tor stream isolation (default: %u)", DEFAULT_PROXYRANDOMIZE), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-seednode=<ip>", "Connect to a node to retrieve peer addresses, and disconnect. This option can be specified multiple times to connect to multiple nodes. During startup, seednodes will be tried before dnsseeds.", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-networkactive", "Enable all P2P network activity (default: 1). Can be changed by the setnetworkactive RPC command", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-timeout=<n>", strprintf("Specify socket connection timeout in milliseconds. If an initial attempt to connect is unsuccessful after this amount of time, drop it (minimum: 1, default: %d)", DEFAULT_CONNECT_TIMEOUT), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-peertimeout=<n>", strprintf("Specify a p2p connection timeout delay in seconds. After connecting to a peer, wait this amount of time before considering disconnection based on inactivity (minimum: 1, default: %d)", DEFAULT_PEER_CONNECT_TIMEOUT), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::CONNECTION);
    argsman.AddArg("-torcontrol=<ip>:<port>", strprintf("Tor control host and port to use if onion listening enabled (default: %s). If no port is specified, the default port of %i will be used.", DEFAULT_TOR_CONTROL, DEFAULT_TOR_CONTROL_PORT), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-torpassword=<pass>", "Tor control port password (default: empty)", ArgsManager::ALLOW_ANY | ArgsManager::SENSITIVE, OptionsCategory::CONNECTION);
#ifdef USE_UPNP
    argsman.AddArg("-upnp", strprintf("Use UPnP to map the listening port (default: %u)", DEFAULT_UPNP), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
#else
    hidden_args.emplace_back("-upnp");
#endif
#ifdef USE_NATPMP
    argsman.AddArg("-natpmp", strprintf("Use NAT-PMP to map the listening port (default: %u)", DEFAULT_NATPMP), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
#else
    hidden_args.emplace_back("-natpmp");
#endif // USE_NATPMP
    argsman.AddArg("-whitebind=<[permissions@]addr>", "Bind to the given address and add permission flags to the peers connecting to it. "
        "Use [host]:port notation for IPv6. Allowed permissions: " + Join(NET_PERMISSIONS_DOC, ", ") + ". "
        "Specify multiple permissions separated by commas (default: download,noban,mempool,relay). Can be specified multiple times.", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);

    argsman.AddArg("-whitelist=<[permissions@]IP address or network>", "Add permission flags to the peers using the given IP address (e.g. 1.2.3.4) or "
        "CIDR-notated network (e.g. 1.2.3.0/24). Uses the same permissions as "
        "-whitebind. "
        "Additional flags \"in\" and \"out\" control whether permissions apply to incoming connections and/or manual (default: incoming only). "
        "Can be specified multiple times.", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);

    g_wallet_init_interface.AddWalletOptions(argsman);

#ifdef ENABLE_ZMQ
    argsman.AddArg("-zmqpubhashblock=<address>", "Enable publish hash block in <address>", ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubhashtx=<address>", "Enable publish hash transaction in <address>", ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubrawblock=<address>", "Enable publish raw block in <address>", ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubrawtx=<address>", "Enable publish raw transaction in <address>", ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubsequence=<address>", "Enable publish hash block and tx sequence in <address>", ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubhashblockhwm=<n>", strprintf("Set publish hash block outbound message high water mark (default: %d)", CZMQAbstractNotifier::DEFAULT_ZMQ_SNDHWM), ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubhashtxhwm=<n>", strprintf("Set publish hash transaction outbound message high water mark (default: %d)", CZMQAbstractNotifier::DEFAULT_ZMQ_SNDHWM), ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubrawblockhwm=<n>", strprintf("Set publish raw block outbound message high water mark (default: %d)", CZMQAbstractNotifier::DEFAULT_ZMQ_SNDHWM), ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubrawtxhwm=<n>", strprintf("Set publish raw transaction outbound message high water mark (default: %d)", CZMQAbstractNotifier::DEFAULT_ZMQ_SNDHWM), ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubsequencehwm=<n>", strprintf("Set publish hash sequence message high water mark (default: %d)", CZMQAbstractNotifier::DEFAULT_ZMQ_SNDHWM), ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
#else
    hidden_args.emplace_back("-zmqpubhashblock=<address>");
    hidden_args.emplace_back("-zmqpubhashtx=<address>");
    hidden_args.emplace_back("-zmqpubrawblock=<address>");
    hidden_args.emplace_back("-zmqpubrawtx=<address>");
    hidden_args.emplace_back("-zmqpubsequence=<n>");
    hidden_args.emplace_back("-zmqpubhashblockhwm=<n>");
    hidden_args.emplace_back("-zmqpubhashtxhwm=<n>");
    hidden_args.emplace_back("-zmqpubrawblockhwm=<n>");
    hidden_args.emplace_back("-zmqpubrawtxhwm=<n>");
    hidden_args.emplace_back("-zmqpubsequencehwm=<n>");
#endif

    argsman.AddArg("-checkblocks=<n>", strprintf("How many blocks to check at startup (default: %u, 0 = all)", DEFAULT_CHECKBLOCKS), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-checklevel=<n>", strprintf("How thorough the block verification of -checkblocks is: %s (0-4, default: %u)", Join(CHECKLEVEL_DOC, ", "), DEFAULT_CHECKLEVEL), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-checkblockindex", strprintf("Do a consistency check for the block tree, chainstate, and other validation data structures every <n> operations. Use 0 to disable. (default: %u, regtest: %u)", defaultChainParams->DefaultConsistencyChecks(), regtestChainParams->DefaultConsistencyChecks()), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-checkaddrman=<n>", strprintf("Run addrman consistency checks every <n> operations. Use 0 to disable. (default: %u)", DEFAULT_ADDRMAN_CONSISTENCY_CHECKS), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-checkmempool=<n>", strprintf("Run mempool consistency checks every <n> transactions. Use 0 to disable. (default: %u, regtest: %u)", defaultChainParams->DefaultConsistencyChecks(), regtestChainParams->DefaultConsistencyChecks()), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-checkpoints", strprintf("Enable rejection of any forks from the known historical chain until block %s (default: %u)", defaultChainParams->Checkpoints().GetHeight(), DEFAULT_CHECKPOINTS_ENABLED), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-deprecatedrpc=<method>", "Allows deprecated RPC method(s) to be used", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-stopafterblockimport", strprintf("Stop running after importing blocks from disk (default: %u)", DEFAULT_STOPAFTERBLOCKIMPORT), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-stopatheight", strprintf("Stop running after reaching the given height in the main chain (default: %u)", DEFAULT_STOPATHEIGHT), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-limitancestorcount=<n>", strprintf("Do not accept transactions if number of in-mempool ancestors is <n> or more (default: %u)", DEFAULT_ANCESTOR_LIMIT), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-limitancestorsize=<n>", strprintf("Do not accept transactions whose size with all in-mempool ancestors exceeds <n> kilobytes (default: %u)", DEFAULT_ANCESTOR_SIZE_LIMIT_KVB), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-limitdescendantcount=<n>", strprintf("Do not accept transactions if any ancestor would have <n> or more in-mempool descendants (default: %u)", DEFAULT_DESCENDANT_LIMIT), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-limitdescendantsize=<n>", strprintf("Do not accept transactions if any ancestor would have more than <n> kilobytes of in-mempool descendants (default: %u).", DEFAULT_DESCENDANT_SIZE_LIMIT_KVB), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-test=<option>", "Pass a test-only option. Options include : " + Join(TEST_OPTIONS_DOC, ", ") + ".", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-capturemessages", "Capture all P2P messages to disk", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-mocktime=<n>", "Replace actual time with " + UNIX_EPOCH_TIME + " (default: 0)", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-maxsigcachesize=<n>", strprintf("Limit sum of signature cache and script execution cache sizes to <n> MiB (default: %u)", DEFAULT_VALIDATION_CACHE_BYTES >> 20), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-maxtipage=<n>",
                   strprintf("Maximum tip age in seconds to consider node in initial block download (default: %u)",
                             Ticks<std::chrono::seconds>(DEFAULT_MAX_TIP_AGE)),
                   ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-printpriority", strprintf("Log transaction fee rate in " + CURRENCY_UNIT + "/kvB when mining blocks (default: %u)", DEFAULT_PRINT_MODIFIED_FEE), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-uacomment=<cmt>", "Append comment to the user agent string", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);

    SetupChainParamsBaseOptions(argsman);

    argsman.AddArg("-acceptnonstdtxn", strprintf("Relay and mine \"non-standard\" transactions (test networks only; default: %u)", DEFAULT_ACCEPT_NON_STD_TXN), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-incrementalrelayfee=<amt>", strprintf("Fee rate (in %s/kvB) used to define cost of relay, used for mempool limiting and replacement policy. (default: %s)", CURRENCY_UNIT, FormatMoney(DEFAULT_INCREMENTAL_RELAY_FEE)), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-dustrelayfee=<amt>", strprintf("Fee rate (in %s/kvB) used to define dust, the value of an output such that it will cost more than its value in fees at this fee rate to spend it. (default: %s)", CURRENCY_UNIT, FormatMoney(DUST_RELAY_TX_FEE)), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-acceptstalefeeestimates", strprintf("Read fee estimates even if they are stale (%sdefault: %u) fee estimates are considered stale if they are %s hours old", "regtest only; ", DEFAULT_ACCEPT_STALE_FEE_ESTIMATES, Ticks<std::chrono::hours>(MAX_FILE_AGE)), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-bytespersigop", strprintf("Equivalent bytes per sigop in transactions for relay and mining (default: %u)", DEFAULT_BYTES_PER_SIGOP), ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-datacarrier", strprintf("Relay and mine data carrier transactions (default: %u)", DEFAULT_ACCEPT_DATACARRIER), ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-datacarriersize",
                   strprintf("Relay and mine transactions whose data-carrying raw scriptPubKey "
                             "is of this size or less (default: %u)",
                             MAX_OP_RETURN_RELAY),
                   ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-mempoolfullrbf", strprintf("(DEPRECATED) Accept transaction replace-by-fee without requiring replaceability signaling (default: %u)", DEFAULT_MEMPOOL_FULL_RBF), ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-permitbaremultisig", strprintf("Relay transactions creating non-P2SH multisig outputs (default: %u)", DEFAULT_PERMIT_BAREMULTISIG), ArgsManager::ALLOW_ANY,
                   OptionsCategory::NODE_RELAY);
    argsman.AddArg("-minrelaytxfee=<amt>", strprintf("Fees (in %s/kvB) smaller than this are considered zero fee for relaying, mining and transaction creation (default: %s)",
        CURRENCY_UNIT, FormatMoney(DEFAULT_MIN_RELAY_TX_FEE)), ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-whitelistforcerelay", strprintf("Add 'forcerelay' permission to whitelisted peers with default permissions. This will relay transactions even if the transactions were already in the mempool. (default: %d)", DEFAULT_WHITELISTFORCERELAY), ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-whitelistrelay", strprintf("Add 'relay' permission to whitelisted peers with default permissions. This will accept relayed transactions even when not relaying transactions (default: %d)", DEFAULT_WHITELISTRELAY), ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);


    argsman.AddArg("-blockmaxweight=<n>", strprintf("Set maximum BIP141 block weight (default: %d)", DEFAULT_BLOCK_MAX_WEIGHT), ArgsManager::ALLOW_ANY, OptionsCategory::BLOCK_CREATION);
    argsman.AddArg("-blockmintxfee=<amt>", strprintf("Set lowest fee rate (in %s/kvB) for transactions to be included in block creation. (default: %s)", CURRENCY_UNIT, FormatMoney(DEFAULT_BLOCK_MIN_TX_FEE)), ArgsManager::ALLOW_ANY, OptionsCategory::BLOCK_CREATION);
    argsman.AddArg("-blockversion=<n>", "Override block version to test forking scenarios", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::BLOCK_CREATION);

    argsman.AddArg("-rest", strprintf("Accept public REST requests (default: %u)", DEFAULT_REST_ENABLE), ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpcallowip=<ip>", "Allow JSON-RPC connections from specified source. Valid values for <ip> are a single IP (e.g. 1.2.3.4), a network/netmask (e.g. 1.2.3.4/255.255.255.0), a network/CIDR (e.g. 1.2.3.4/24), all ipv4 (0.0.0.0/0), or all ipv6 (::/0). This option can be specified multiple times", ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpcauth=<userpw>", "Username and HMAC-SHA-256 hashed password for JSON-RPC connections. The field <userpw> comes in the format: <USERNAME>:<SALT>$<HASH>. A canonical python script is included in share/rpcauth. The client then connects normally using the rpcuser=<USERNAME>/rpcpassword=<PASSWORD> pair of arguments. This option can be specified multiple times", ArgsManager::ALLOW_ANY | ArgsManager::SENSITIVE, OptionsCategory::RPC);
    argsman.AddArg("-rpcbind=<addr>[:port]", "Bind to given address to listen for JSON-RPC connections. Do not expose the RPC server to untrusted networks such as the public internet! This option is ignored unless -rpcallowip is also passed. Port is optional and overrides -rpcport. Use [host]:port notation for IPv6. This option can be specified multiple times (default: 127.0.0.1 and ::1 i.e., localhost)", ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::RPC);
    argsman.AddArg("-rpcdoccheck", strprintf("Throw a non-fatal error at runtime if the documentation for an RPC is incorrect (default: %u)", DEFAULT_RPC_DOC_CHECK), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::RPC);
    argsman.AddArg("-rpccookiefile=<loc>", "Location of the auth cookie. Relative paths will be prefixed by a net-specific datadir location. (default: data dir)", ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpccookieperms=<readable-by>", strprintf("Set permissions on the RPC auth cookie file so that it is readable by [owner|group|all] (default: owner [via umask 0077])"), ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpcpassword=<pw>", "Password for JSON-RPC connections", ArgsManager::ALLOW_ANY | ArgsManager::SENSITIVE, OptionsCategory::RPC);
    argsman.AddArg("-rpcport=<port>", strprintf("Listen for JSON-RPC connections on <port> (default: %u, testnet3: %u, testnet4: %u, signet: %u, regtest: %u)", defaultBaseParams->RPCPort(), testnetBaseParams->RPCPort(), testnet4BaseParams->RPCPort(), signetBaseParams->RPCPort(), regtestBaseParams->RPCPort()), ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::RPC);
    argsman.AddArg("-rpcservertimeout=<n>", strprintf("Timeout during HTTP requests (default: %d)", DEFAULT_HTTP_SERVER_TIMEOUT), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::RPC);
    argsman.AddArg("-rpcthreads=<n>", strprintf("Set the number of threads to service RPC calls (default: %d)", DEFAULT_HTTP_THREADS), ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpcuser=<user>", "Username for JSON-RPC connections", ArgsManager::ALLOW_ANY | ArgsManager::SENSITIVE, OptionsCategory::RPC);
    argsman.AddArg("-rpcwhitelist=<whitelist>", "Set a whitelist to filter incoming RPC calls for a specific user. The field <whitelist> comes in the format: <USERNAME>:<rpc 1>,<rpc 2>,...,<rpc n>. If multiple whitelists are set for a given user, they are set-intersected. See -rpcwhitelistdefault documentation for information on default whitelist behavior.", ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpcwhitelistdefault", "Sets default behavior for rpc whitelisting. Unless rpcwhitelistdefault is set to 0, if any -rpcwhitelist is set, the rpc server acts as if all rpc users are subject to empty-unless-otherwise-specified whitelists. If rpcwhitelistdefault is set to 1 and no -rpcwhitelist is set, rpc server acts as if all rpc users are subject to empty whitelists.", ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpcworkqueue=<n>", strprintf("Set the depth of the work queue to service RPC calls (default: %d)", DEFAULT_HTTP_WORKQUEUE), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::RPC);
    argsman.AddArg("-server", "Accept command line and JSON-RPC commands", ArgsManager::ALLOW_ANY, OptionsCategory::RPC);

#if HAVE_DECL_FORK
    argsman.AddArg("-daemon", strprintf("Run in the background as a daemon and accept commands (default: %d)", DEFAULT_DAEMON), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-daemonwait", strprintf("Wait for initialization to be finished before exiting. This implies -daemon (default: %d)", DEFAULT_DAEMONWAIT), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
#else
    hidden_args.emplace_back("-daemon");
    hidden_args.emplace_back("-daemonwait");
#endif

    // Add the hidden options
    argsman.AddHiddenArgs(hidden_args);
}